

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseRegisterNumber
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,int numValues)

{
  Token *pTVar1;
  int64_t iVar2;
  int64_t local_70;
  string local_68;
  Identifier local_48;
  
  pTVar1 = Parser::peekToken(parser,0);
  if (((pTVar1->type == Dollar) && (pTVar1 = Parser::peekToken(parser,1), pTVar1->type == Integer))
     && (iVar2 = Token::intValue(pTVar1), iVar2 < numValues)) {
    local_70 = Token::intValue(pTVar1);
    tinyformat::format<long>(&local_68,"$%d",&local_70);
    Identifier::Identifier(&local_48,&local_68);
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    iVar2 = Token::intValue(pTVar1);
    dest->num = (int)iVar2;
    Parser::eatTokens(parser,2);
    return true;
  }
  return false;
}

Assistant:

bool MipsParser::parseRegisterNumber(Parser& parser, MipsRegisterValue& dest, int numValues)
{
	// check for $0 and $1
	if (parser.peekToken().type == TokenType::Dollar)
	{
		const Token& number = parser.peekToken(1);
		if (number.type == TokenType::Integer && number.intValue() < numValues)
		{
			dest.name = Identifier(tfm::format("$%d", number.intValue()));
			dest.num = (int) number.intValue();

			parser.eatTokens(2);
			return true;
		}
	}

	return false;
}